

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_GetIterator(JSContext *ctx,JSValue obj,BOOL is_async)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue method_00;
  JSValue method_01;
  JSValue obj_00;
  JSValue obj_01;
  JSValue v_02;
  JSValue sync_iter_00;
  JSValue val;
  int iVar1;
  int in_ECX;
  JSContext *in_RDI;
  JSValue JVar2;
  JSContext *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  JSValue in_stack_00000018;
  JSValue sync_iter;
  JSValue ret;
  JSValue method;
  JSContext *in_stack_fffffffffffffeb0;
  JSValueUnion in_stack_fffffffffffffeb8;
  JSValueUnion in_stack_fffffffffffffec0;
  JSContext *in_stack_fffffffffffffed0;
  JSValueUnion in_stack_fffffffffffffed8;
  int64_t in_stack_fffffffffffffee0;
  JSValueUnion in_stack_fffffffffffffee8;
  int64_t in_stack_fffffffffffffef0;
  int64_t in_stack_ffffffffffffff20;
  JSValueUnion local_d0;
  int64_t local_c8;
  JSValueUnion local_a0;
  JSValueUnion local_98;
  JSValueUnion local_70;
  int64_t local_68;
  JSValueUnion local_40;
  JSValueUnion local_10;
  JSAtom prop;
  
  if (in_ECX == 0) {
    JVar2 = JS_GetPropertyInternal
                      (unaff_retaddr,in_stack_00000018,prop,(JSValue)in_stack_00000008,(BOOL)ctx);
    local_70 = JVar2.u;
    local_68 = JVar2.tag;
    local_d0.float64 = local_70.float64;
    local_c8 = local_68;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 != 0) {
      return JVar2;
    }
  }
  else {
    JVar2 = JS_GetPropertyInternal
                      (unaff_retaddr,in_stack_00000018,prop,(JSValue)in_stack_00000008,(BOOL)ctx);
    local_10 = JVar2.u;
    local_c8 = JVar2.tag;
    local_d0 = local_10;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 != 0) {
      return JVar2;
    }
    iVar1 = JS_IsUndefined(JVar2);
    if ((iVar1 != 0) || (iVar1 = JS_IsNull(JVar2), local_70 = in_stack_fffffffffffffec0, iVar1 != 0)
       ) {
      prop = JVar2.tag._4_4_;
      JVar2 = JS_GetPropertyInternal
                        (unaff_retaddr,in_stack_00000018,prop,(JSValue)in_stack_00000008,(BOOL)ctx);
      local_40 = JVar2.u;
      iVar1 = JS_IsException(JVar2);
      if (iVar1 != 0) {
        return JVar2;
      }
      obj_00.tag = (int64_t)local_40.ptr;
      obj_00.u.float64 = in_stack_fffffffffffffee8.float64;
      method_00.tag = in_stack_fffffffffffffee0;
      method_00.u.float64 = in_stack_fffffffffffffed8.float64;
      JVar2 = JS_GetIterator2(in_stack_fffffffffffffed0,obj_00,method_00);
      local_a0 = JVar2.u;
      local_98 = (JSValueUnion)JVar2.tag;
      JVar2.tag = (int64_t)in_stack_fffffffffffffec0.ptr;
      JVar2.u.ptr = in_stack_fffffffffffffeb8.ptr;
      JS_FreeValue(in_stack_fffffffffffffeb0,JVar2);
      v_02.tag = (int64_t)local_98.ptr;
      v_02.u.ptr = local_a0.ptr;
      iVar1 = JS_IsException(v_02);
      if (iVar1 != 0) {
        return _local_a0;
      }
      sync_iter_00.tag = in_stack_ffffffffffffff20;
      sync_iter_00.u.ptr = local_98.ptr;
      JVar2 = JS_CreateAsyncFromSyncIterator((JSContext *)local_a0.ptr,sync_iter_00);
      local_a0 = JVar2.u;
      v.tag = (int64_t)in_stack_fffffffffffffec0.ptr;
      v.u.ptr = in_stack_fffffffffffffeb8.ptr;
      JS_FreeValue(in_stack_fffffffffffffeb0,v);
      local_98 = (JSValueUnion)JVar2.tag;
      return _local_a0;
    }
  }
  val.tag = local_c8;
  val.u.float64 = local_d0.float64;
  iVar1 = JS_IsFunction(in_RDI,val);
  if (iVar1 == 0) {
    v_00.tag = (int64_t)local_70.ptr;
    v_00.u.float64 = in_stack_fffffffffffffeb8.float64;
    JS_FreeValue(in_stack_fffffffffffffeb0,v_00);
    _local_a0 = JS_ThrowTypeError(in_RDI,"value is not iterable");
  }
  else {
    obj_01.tag = in_stack_fffffffffffffef0;
    obj_01.u.float64 = in_stack_fffffffffffffee8.float64;
    method_01.tag = in_stack_fffffffffffffee0;
    method_01.u.float64 = in_stack_fffffffffffffed8.float64;
    JVar2 = JS_GetIterator2(in_stack_fffffffffffffed0,obj_01,method_01);
    local_a0 = JVar2.u;
    v_01.tag = (int64_t)local_70.ptr;
    v_01.u.ptr = (void *)JVar2.tag;
    JS_FreeValue((JSContext *)local_a0.ptr,v_01);
    local_98 = (JSValueUnion)(JSValueUnion)JVar2.tag;
  }
  return _local_a0;
}

Assistant:

static JSValue JS_GetIterator(JSContext *ctx, JSValueConst obj, BOOL is_async)
{
    JSValue method, ret, sync_iter;

    if (is_async) {
        method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_asyncIterator);
        if (JS_IsException(method))
            return method;
        if (JS_IsUndefined(method) || JS_IsNull(method)) {
            method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_iterator);
            if (JS_IsException(method))
                return method;
            sync_iter = JS_GetIterator2(ctx, obj, method);
            JS_FreeValue(ctx, method);
            if (JS_IsException(sync_iter))
                return sync_iter;
            ret = JS_CreateAsyncFromSyncIterator(ctx, sync_iter);
            JS_FreeValue(ctx, sync_iter);
            return ret;
        }
    } else {
        method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_iterator);
        if (JS_IsException(method))
            return method;
    }
    if (!JS_IsFunction(ctx, method)) {
        JS_FreeValue(ctx, method);
        return JS_ThrowTypeError(ctx, "value is not iterable");
    }
    ret = JS_GetIterator2(ctx, obj, method);
    JS_FreeValue(ctx, method);
    return ret;
}